

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O0

size_t portability_path_get_extension
                 (char *path,size_t path_size,char *extension,size_t extension_size)

{
  size_t sVar1;
  size_t count;
  size_t i;
  size_t extension_size_local;
  char *extension_local;
  size_t path_size_local;
  char *path_local;
  size_t local_8;
  
  if ((path == (char *)0x0) || (extension == (char *)0x0)) {
    local_8 = 0;
  }
  else {
    count = 0;
    for (i = 0; path[i] != '\0' && i < path_size; i = i + 1) {
      sVar1 = count + 1;
      extension[count] = path[i];
      if (((path[i] == '/') || (path[i] == '.')) || (count = sVar1, sVar1 == extension_size)) {
        count = 0;
      }
    }
    extension[count] = '\0';
    local_8 = count + 1;
  }
  return local_8;
}

Assistant:

size_t portability_path_get_extension(const char *path, size_t path_size, char *extension, size_t extension_size)
{
	if (path == NULL || extension == NULL)
	{
		return 0;
	}

	size_t i, count;

	for (i = 0, count = 0; path[i] != '\0' && i < path_size; ++i)
	{
		extension[count++] = path[i];

		if (PORTABILITY_PATH_SEPARATOR(path[i]) || path[i] == '.' || count == extension_size)
		{
			count = 0;
		}
	}

	extension[count] = '\0';

	return count + 1;
}